

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O1

void __thiscall TokenScanner::~TokenScanner(TokenScanner *this)

{
  ~TokenScanner(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TokenScanner::~TokenScanner() {
   if (stringInputFlag) delete isp;
}